

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

bool __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint max_size,
          progress_callback_func_ptr pProgress_callback,void *pProgress_data,bool quick)

{
  node_vec_type *this_00;
  vector<unsigned_int> *this_01;
  vector<unsigned_int> *this_02;
  vector<unsigned_int> *this_03;
  uint *puVar1;
  undefined8 uVar2;
  uint uVar3;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar4;
  void *p;
  vq_node *pvVar5;
  uint *puVar6;
  vec<2U,_float> *p_00;
  float fVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  vq_node *pvVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float local_78;
  float fStack_74;
  ulong uStack_70;
  vector<unsigned_int> local_60;
  undefined5 local_50;
  undefined3 uStack_4b;
  undefined4 local_48;
  undefined1 local_44;
  void *local_38;
  
  uVar3 = (this->m_training_vecs).m_size;
  if (uVar3 == 0) {
    return false;
  }
  this->m_quick = quick;
  local_60.m_p = (uint *)0x0;
  local_60.m_size = 0;
  local_60.m_capacity = 0;
  local_78 = 0.0;
  fStack_74 = 0.0;
  uStack_70 = 0;
  local_50 = 0xffffffffff;
  uStack_4b = 0xffffff;
  local_48 = 0xffffffff;
  local_44 = 0;
  local_38 = pProgress_data;
  vector<unsigned_int>::reserve(&local_60,uVar3);
  if ((this->m_training_vecs).m_size == 0) {
    fVar7 = 0.0;
  }
  else {
    fVar7 = 0.0;
    lVar16 = 0;
    uVar13 = 0;
    do {
      ppVar4 = (this->m_training_vecs).m_p;
      uVar10 = (ulong)*(uint *)((long)(&ppVar4->first + 1) + lVar16);
      fVar19 = (float)uVar10;
      uVar2 = *(undefined8 *)((long)(ppVar4->first).m_s + lVar16);
      local_78 = local_78 + fVar19 * (float)uVar2;
      fStack_74 = fStack_74 + fVar19 * (float)((ulong)uVar2 >> 0x20);
      uStack_70 = uStack_70 + uVar10;
      if (local_60.m_capacity <= local_60.m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_60,local_60.m_size + 1,true,4,(object_mover)0x0,false)
        ;
      }
      local_60.m_p[local_60.m_size] = (uint)uVar13;
      local_60.m_size = local_60.m_size + 1;
      uVar2 = *(undefined8 *)((long)(ppVar4->first).m_s + lVar16);
      fVar17 = (float)uVar2;
      fVar18 = (float)((ulong)uVar2 >> 0x20);
      fVar7 = fVar7 + (fVar18 * fVar18 + fVar17 * fVar17) * fVar19;
      uVar13 = uVar13 + 1;
      lVar16 = lVar16 + 0xc;
    } while (uVar13 < (this->m_training_vecs).m_size);
  }
  fVar19 = 1.0 / (float)uStack_70;
  this_00 = &this->m_nodes;
  pvVar15 = (this->m_nodes).m_p;
  if (pvVar15 != (vq_node *)0x0) {
    uVar13 = (ulong)(this->m_nodes).m_size;
    if (uVar13 != 0) {
      lVar16 = 0;
      do {
        p = *(void **)((long)&((vector<unsigned_int> *)(&pvVar15->m_centroid + 3))->m_p + lVar16);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar16 = lVar16 + 0x38;
      } while (uVar13 * 0x38 - lVar16 != 0);
      pvVar15 = this_00->m_p;
    }
    crnlib_free(pvVar15);
    this_00->m_p = (vq_node *)0x0;
    (this->m_nodes).m_size = 0;
    (this->m_nodes).m_capacity = 0;
  }
  vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::reserve(this_00,max_size * 2 + 1);
  uVar11 = (this->m_nodes).m_size;
  if ((this->m_nodes).m_capacity <= uVar11) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this_00,uVar11 + 1,true,0x38,
               vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::object_mover,false);
    uVar11 = (this->m_nodes).m_size;
  }
  pvVar5 = this_00->m_p;
  pvVar15 = pvVar5 + uVar11;
  (pvVar15->m_centroid).m_s[0] = fVar19 * local_78;
  (pvVar15->m_centroid).m_s[1] = fVar19 * fStack_74;
  pvVar15->m_total_weight = uStack_70;
  pvVar15->m_variance = fVar7 - (fStack_74 * fStack_74 + local_78 * local_78) / (float)uStack_70;
  (pvVar15->m_vectors).m_p = (uint *)0x0;
  (pvVar15->m_vectors).m_size = 0;
  (pvVar15->m_vectors).m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&pvVar15->m_vectors,local_60.m_size,false,4,(object_mover)0x0,false
            );
  pvVar5[uVar11].m_vectors.m_size = local_60.m_size;
  memcpy(pvVar5[uVar11].m_vectors.m_p,local_60.m_p,(ulong)local_60.m_size << 2);
  pvVar5[uVar11].m_left = (int)local_50;
  pvVar5[uVar11].m_right = (int)(CONCAT35(uStack_4b,local_50) >> 0x20);
  *(ulong *)((long)&pvVar5[uVar11].m_right + 1) = CONCAT17(local_44,CONCAT43(local_48,uStack_4b));
  puVar1 = &(this->m_nodes).m_size;
  *puVar1 = *puVar1 + 1;
  this_01 = &this->m_heap;
  uVar11 = max_size + 1;
  uVar12 = (this->m_heap).m_size;
  if (uVar12 != uVar11) {
    if (uVar12 <= uVar11) {
      if ((this->m_heap).m_capacity < uVar11) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_01,uVar11,uVar12 == max_size,4,(object_mover)0x0,false);
        uVar12 = (this->m_heap).m_size;
      }
      memset(this_01->m_p + uVar12,0,(ulong)(uVar11 - uVar12) << 2);
    }
    (this->m_heap).m_size = uVar11;
  }
  (this->m_heap).m_p[1] = 0;
  this->m_heap_size = 1;
  this->m_split_index = 0;
  this_02 = &this->m_left_children;
  vector<unsigned_int>::reserve(this_02,(this->m_training_vecs).m_size + 1);
  this_03 = &this->m_right_children;
  vector<unsigned_int>::reserve(this_03,(this->m_training_vecs).m_size + 1);
  uVar12 = 1;
  uVar11 = 0xffffffff;
  do {
    if ((max_size <= uVar12) || (uVar9 = this->m_heap_size, uVar9 == 0)) {
LAB_0014d985:
      p_00 = (this->m_codebook).m_p;
      if (p_00 != (vec<2U,_float> *)0x0) {
        crnlib_free(p_00);
        (this->m_codebook).m_p = (vec<2U,_float> *)0x0;
        (this->m_codebook).m_size = 0;
        (this->m_codebook).m_capacity = 0;
      }
      this->m_overall_variance = 0.0;
      uVar11 = (this->m_nodes).m_size;
      if (uVar11 != 0) {
        lVar16 = 0x30;
        uVar13 = 0;
        do {
          pvVar15 = this_00->m_p;
          if (*(int *)((long)(&pvVar15->m_centroid + -1) + lVar16) == -1) {
            uVar11 = (this->m_codebook).m_size;
            *(uint *)((long)(pvVar15->m_centroid).m_s + lVar16) = uVar11;
            if ((this->m_codebook).m_capacity <= uVar11) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_codebook,uVar11 + 1,true,8,(object_mover)0x0,
                         false);
              uVar11 = (this->m_codebook).m_size;
            }
            *(undefined8 *)(this->m_codebook).m_p[uVar11].m_s =
                 *(undefined8 *)((long)(&pvVar15->m_centroid + -6) + lVar16);
            puVar1 = &(this->m_codebook).m_size;
            *puVar1 = *puVar1 + 1;
            this->m_overall_variance =
                 *(float *)((long)(&pvVar15->m_centroid + -4) + lVar16) + this->m_overall_variance;
            uVar11 = (this->m_nodes).m_size;
          }
          uVar13 = uVar13 + 1;
          lVar16 = lVar16 + 0x38;
        } while (uVar13 < uVar11);
      }
      if (this_01->m_p != (uint *)0x0) {
        crnlib_free(this_01->m_p);
        this_01->m_p = (uint *)0x0;
        (this->m_heap).m_size = 0;
        (this->m_heap).m_capacity = 0;
      }
      if (this_02->m_p != (uint *)0x0) {
        crnlib_free(this_02->m_p);
        this_02->m_p = (uint *)0x0;
        (this->m_left_children).m_size = 0;
        (this->m_left_children).m_capacity = 0;
      }
      bVar8 = true;
      if (this_03->m_p != (uint *)0x0) {
        crnlib_free(this_03->m_p);
        this_03->m_p = (uint *)0x0;
        (this->m_right_children).m_size = 0;
        (this->m_right_children).m_capacity = 0;
      }
      goto LAB_0014da80;
    }
    uVar14 = uVar12 * 100 + (max_size >> 1) + 100;
    while( true ) {
      uVar12 = uVar12 + 1;
      puVar6 = (this->m_heap).m_p;
      uVar3 = puVar6[1];
      puVar6[1] = puVar6[uVar9];
      puVar1 = &this->m_heap_size;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 != 0) {
        down_heap(this,1);
      }
      split_node(this,uVar3);
      if (((uVar12 & 0x3f) == 0 && pProgress_callback != (progress_callback_func_ptr)0x0) &&
         (uVar9 = uVar14 / max_size, uVar9 != uVar11)) break;
      if (max_size <= uVar12) goto LAB_0014d985;
      uVar14 = uVar14 + 100;
      uVar9 = this->m_heap_size;
      if (uVar9 == 0) goto LAB_0014d985;
    }
    bVar8 = (*pProgress_callback)(uVar9,local_38);
    uVar11 = uVar9;
  } while (bVar8);
  bVar8 = false;
LAB_0014da80:
  if (local_60.m_p == (uint *)0x0) {
    return bVar8;
  }
  crnlib_free(local_60.m_p);
  return bVar8;
}

Assistant:

bool generate_codebook(uint max_size, progress_callback_func_ptr pProgress_callback = NULL, void* pProgress_data = NULL, bool quick = false) {
    if (m_training_vecs.empty())
      return false;

    m_quick = quick;

    double ttsum = 0.0f;

    vq_node root;
    root.m_vectors.reserve(m_training_vecs.size());

    for (uint i = 0; i < m_training_vecs.size(); i++) {
      const VectorType& v = m_training_vecs[i].first;
      const uint weight = m_training_vecs[i].second;

      root.m_centroid += (v * (float)weight);
      root.m_total_weight += weight;
      root.m_vectors.push_back(i);

      ttsum += v.dot(v) * weight;
    }

    root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));

    root.m_centroid *= (1.0f / root.m_total_weight);

    m_nodes.clear();
    m_nodes.reserve(max_size * 2 + 1);

    m_nodes.push_back(root);

    m_heap.resize(max_size + 1);
    m_heap[1] = 0;
    m_heap_size = 1;

    m_split_index = 0;

    uint total_leaves = 1;

    m_left_children.reserve(m_training_vecs.size() + 1);
    m_right_children.reserve(m_training_vecs.size() + 1);

    int prev_percentage = -1;
    while ((total_leaves < max_size) && (m_heap_size)) {
      int worst_node_index = m_heap[1];

      m_heap[1] = m_heap[m_heap_size];
      m_heap_size--;
      if (m_heap_size)
        down_heap(1);

      split_node(worst_node_index);
      total_leaves++;

      if ((pProgress_callback) && ((total_leaves & 63) == 0) && (max_size)) {
        int cur_percentage = (total_leaves * 100U + (max_size / 2U)) / max_size;
        if (cur_percentage != prev_percentage) {
          if (!(*pProgress_callback)(cur_percentage, pProgress_data))
            return false;

          prev_percentage = cur_percentage;
        }
      }
    }

    m_codebook.clear();

    m_overall_variance = 0.0f;

    for (uint i = 0; i < m_nodes.size(); i++) {
      vq_node& node = m_nodes[i];
      if (node.m_left != -1) {
        CRNLIB_ASSERT(node.m_right != -1);
        continue;
      }

      CRNLIB_ASSERT((node.m_left == -1) && (node.m_right == -1));

      node.m_codebook_index = m_codebook.size();
      m_codebook.push_back(node.m_centroid);

      m_overall_variance += node.m_variance;
    }

    m_heap.clear();
    m_left_children.clear();
    m_right_children.clear();

    return true;
  }